

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lua.cpp
# Opt level: O0

char * get_prompt(lua_State *L,int firstline)

{
  char *pcVar1;
  char *local_20;
  char *p;
  int firstline_local;
  lua_State *L_local;
  
  pcVar1 = "_PROMPT2";
  if (firstline != 0) {
    pcVar1 = "_PROMPT";
  }
  lua_getglobal(L,pcVar1);
  local_20 = (char *)lua_tolstring(L,-1,(ulong *)0x0);
  if ((local_20 == (char *)0x0) && (local_20 = ">> ", firstline != 0)) {
    local_20 = "> ";
  }
  lua_settop(L,-2);
  return local_20;
}

Assistant:

static const char *get_prompt (lua_State *L, int firstline) {
  const char *p;
  lua_getglobal(L, firstline ? "_PROMPT" : "_PROMPT2");
  p = lua_tostring(L, -1);
  if (p == NULL) p = (firstline ? LUA_PROMPT : LUA_PROMPT2);
  lua_pop(L, 1);  /* remove global */
  return p;
}